

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  BtShared **ppBVar1;
  char *pcVar2;
  char cVar3;
  PCache *pPVar4;
  sqlite3_file *psVar5;
  sqlite3_io_methods *psVar6;
  int iVar7;
  uint uVar8;
  Btree *p;
  BtShared *__s;
  Pager *pPVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  sqlite3_mutex *psVar14;
  sqlite3_mutex *psVar15;
  void *pvVar16;
  uint uVar17;
  uint uVar18;
  Btree **ppBVar19;
  code *pcVar20;
  Btree *pBVar21;
  int iVar22;
  long lVar23;
  Btree *pBVar24;
  u8 uVar25;
  uint uVar26;
  u64 n;
  Btree *pBVar27;
  Btree *pBVar28;
  int iVar29;
  ulong uVar30;
  byte bVar31;
  bool bVar32;
  bool bVar33;
  uchar zDbHeader [100];
  Pager *local_118;
  sqlite3_mutex *local_110;
  uint local_ec;
  char *local_d8;
  char *local_d0;
  byte local_c4;
  u8 local_c0;
  uint local_a4;
  size_t local_a0;
  u32 local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (zFilename == (char *)0x0) {
LAB_00139814:
    bVar32 = true;
    if (db->temp_store != '\x02') goto LAB_0013982b;
LAB_0013981e:
    local_ec = flags | 2;
    uVar17 = 1;
  }
  else {
    cVar3 = *zFilename;
    bVar32 = cVar3 == '\0';
    iVar7 = strcmp(zFilename,":memory:");
    if (iVar7 == 0) goto LAB_0013981e;
    if (cVar3 == '\0') goto LAB_00139814;
    bVar32 = false;
LAB_0013982b:
    uVar17 = (vfsFlags & 0x80U) >> 7;
    local_ec = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar8 = vfsFlags & 0xfffffcffU | 0x200;
  if (uVar17 == 0 && !bVar32) {
    uVar8 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar8 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  iVar7 = 7;
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->pPrev = (Btree *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->nBackup = 0;
  p->iDataVersion = 0;
  p->pNext = (Btree *)0x0;
  p->pBt = (BtShared *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->hasIncrblobCur = '\0';
  p->wantToLock = 0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  local_c4 = (byte)uVar17;
  if (bVar32) {
    local_110 = (sqlite3_mutex *)0x0;
  }
  else {
    if ((uVar8 >> 0x11 & 1) != 0 && ((uVar8 & 0x40) == 0 & local_c4) == 0) {
      if (zFilename == (char *)0x0) {
        uVar17 = 1;
      }
      else {
        sVar10 = strlen(zFilename);
        uVar17 = ((uint)sVar10 & 0x3fffffff) + 1;
      }
      uVar26 = pVfs->mxPathname + 1;
      uVar18 = uVar17;
      if ((int)uVar17 < (int)uVar26) {
        uVar18 = uVar26;
      }
      pcVar12 = (char *)sqlite3Malloc((ulong)uVar18);
      p->sharable = '\x01';
      if (pcVar12 == (char *)0x0) {
LAB_00139b69:
        sqlite3_free(p);
        return iVar7;
      }
      if (local_c4 == 0) {
        *pcVar12 = '\0';
        iVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar26,pcVar12);
        if (iVar7 != 0) {
          sqlite3_free(pcVar12);
          goto LAB_00139b69;
        }
      }
      else {
        memcpy(pcVar12,zFilename,(ulong)uVar17);
      }
      if (sqlite3Config.bCoreMutex == 0) {
        bVar32 = true;
        psVar14 = (sqlite3_mutex *)0x0;
        bVar33 = true;
        local_110 = (sqlite3_mutex *)0x0;
      }
      else {
        local_110 = (*sqlite3Config.mutex.xMutexAlloc)(4);
        bVar33 = local_110 == (sqlite3_mutex *)0x0;
        if (!bVar33) {
          (*sqlite3Config.mutex.xMutexEnter)(local_110);
        }
        if ((sqlite3Config.bCoreMutex == 0) ||
           (psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar14 == (sqlite3_mutex *)0x0)) {
          bVar32 = true;
          psVar14 = (sqlite3_mutex *)0x0;
        }
        else {
          (*sqlite3Config.mutex.xMutexEnter)(psVar14);
          bVar32 = false;
        }
      }
      __s = sqlite3SharedCacheList;
      if (sqlite3SharedCacheList != (BtShared *)0x0) {
LAB_00139eb7:
        pPVar9 = __s->pPager;
        iVar7 = strcmp(pcVar12,pPVar9->zFilename);
        if ((iVar7 != 0) || (pPVar9->pVfs != pVfs)) goto LAB_00139edc;
        lVar23 = (long)db->nDb;
        if (0 < lVar23) {
          uVar13 = lVar23 + 1;
          ppBVar19 = &db->aDb[lVar23 + -1].pBt;
          do {
            if ((*ppBVar19 != (Btree *)0x0) && ((*ppBVar19)->pBt == __s)) {
              if (!bVar32) {
                (*sqlite3Config.mutex.xMutexLeave)(psVar14);
              }
              if (!bVar33) {
                (*sqlite3Config.mutex.xMutexLeave)(local_110);
              }
              sqlite3_free(pcVar12);
              sqlite3_free(p);
              return 0x13;
            }
            uVar13 = uVar13 - 1;
            ppBVar19 = ppBVar19 + -4;
          } while (1 < uVar13);
        }
        p->pBt = __s;
        __s->nRef = __s->nRef + 1;
        goto LAB_00139fbb;
      }
      __s = (BtShared *)0x0;
      goto LAB_00139fbb;
    }
    local_110 = (sqlite3_mutex *)0x0;
  }
LAB_001398e7:
  __s = (BtShared *)sqlite3Malloc(0x88);
  if (__s == (BtShared *)0x0) {
    iVar7 = 7;
  }
  else {
    memset(__s,0,0x88);
    local_98[0] = 0x1000;
    iVar29 = 0x58;
    if (0x58 < pVfs->szOsFile) {
      iVar29 = pVfs->szOsFile;
    }
    __s->pPager = (Pager *)0x0;
    uVar17 = local_ec & 2;
    local_d8 = zFilename;
    if (uVar17 == 0) {
      if (zFilename == (char *)0x0) {
        local_d8 = (char *)0x0;
        bVar32 = true;
LAB_00139c09:
        local_c0 = '\0';
        goto LAB_00139c33;
      }
      if (*zFilename == '\0') {
        bVar32 = false;
        goto LAB_00139c09;
      }
      iVar7 = pVfs->mxPathname;
      pPVar9 = (Pager *)sqlite3Malloc((long)iVar7 * 2 + 2);
      if (pPVar9 == (Pager *)0x0) {
LAB_00139bec:
        iVar7 = 7;
        goto LAB_0013a234;
      }
      *(char *)&pPVar9->pVfs = '\0';
      iVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar7 + 1,(char *)pPVar9);
      sVar10 = strlen((char *)pPVar9);
      sVar11 = strlen(zFilename);
      uVar18 = (uint)sVar11 & 0x3fffffff;
      local_d0 = zFilename + (ulong)uVar18 + 1;
      pcVar12 = local_d0;
      if (*local_d0 == '\0') {
        iVar22 = uVar18 + (int)zFilename;
      }
      else {
        do {
          sVar11 = strlen(pcVar12);
          pcVar2 = pcVar12 + (sVar11 & 0x3fffffff);
          sVar11 = strlen(pcVar12 + (sVar11 & 0x3fffffff) + 1);
          pcVar12 = pcVar2 + (sVar11 & 0x3fffffff) + 2;
        } while (pcVar2[(sVar11 & 0x3fffffff) + 2] != '\0');
        iVar22 = (int)(sVar11 & 0x3fffffff) + (int)pcVar2 + 1;
      }
      if (iVar7 == 0) {
        uVar18 = (uint)sVar10 & 0x3fffffff;
        if ((int)(uVar18 + 8) <= pVfs->mxPathname) {
          iVar7 = (iVar22 - (int)local_d0) + 2;
          bVar32 = false;
          local_c0 = '\0';
          local_118 = pPVar9;
          goto LAB_00139c3f;
        }
        iVar7 = 0xe;
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xd85e,
                    "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
      }
LAB_0013a22a:
      sqlite3_free(pPVar9);
    }
    else {
      if (zFilename == (char *)0x0) {
        local_c0 = '\x01';
        bVar32 = true;
        local_d8 = (char *)0x0;
LAB_00139c33:
        local_118 = (Pager *)0x0;
        uVar18 = 0;
        local_d0 = (char *)0x0;
        iVar7 = 0;
      }
      else {
        if (*zFilename == '\0') {
          local_c0 = '\x01';
          bVar32 = false;
          goto LAB_00139c33;
        }
        iVar7 = 0;
        local_118 = (Pager *)sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
        if (local_118 == (Pager *)0x0) goto LAB_00139bec;
        sVar10 = strlen((char *)local_118);
        uVar18 = (uint)sVar10 & 0x3fffffff;
        bVar32 = true;
        local_d8 = (char *)0x0;
        local_c0 = '\x01';
        local_d0 = (char *)0x0;
      }
LAB_00139c3f:
      uVar13 = (ulong)uVar18;
      local_a0 = (size_t)iVar7;
      uVar30 = (ulong)(iVar29 + 7U & 0x7ffffff8);
      n = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) + uVar13 * 3 + uVar30 * 2 + local_a0 +
          0x189;
      pPVar9 = (Pager *)sqlite3Malloc(n);
      if (pPVar9 == (Pager *)0x0) {
        iVar7 = 7;
        if (local_118 != (Pager *)0x0) {
          sqlite3_free(local_118);
        }
        goto LAB_0013a234;
      }
      memset(pPVar9,0,n);
      pPVar9->pPCache = (PCache *)(pPVar9 + 1);
      pPVar9->fd = (sqlite3_file *)&pPVar9[1].fd;
      pcVar12 = pPVar9[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x40);
      pPVar9->sjfd = (sqlite3_file *)pcVar12;
      pPVar9->jfd = (sqlite3_file *)(pcVar12 + uVar30);
      pcVar12 = pcVar12 + uVar30 + uVar30;
      pPVar9->zFilename = pcVar12;
      if (local_118 != (Pager *)0x0) {
        pPVar9->zJournal = pcVar12 + (int)(iVar7 + uVar18 + 1);
        memcpy(pcVar12,local_118,uVar13);
        if (iVar7 != 0) {
          memcpy(pPVar9->zFilename + (uVar18 + 1),local_d0,local_a0);
        }
        memcpy(pPVar9->zJournal,local_118,uVar13);
        builtin_strncpy(pPVar9->zJournal + uVar13,"-journal",9);
        (pPVar9->zJournal + uVar13 + 8)[1] = '\0';
        pPVar9->zWal = pPVar9->zJournal + uVar13 + 9;
        memcpy(pPVar9->zJournal + uVar13 + 9,local_118,uVar13);
        builtin_strncpy(pPVar9->zWal + uVar13,"-wal",5);
        sqlite3_free(local_118);
      }
      pPVar9->pVfs = pVfs;
      pPVar9->vfsFlags = uVar8;
      if ((!bVar32) && (*local_d8 != '\0')) {
        local_a4 = 0;
        iVar7 = (*pVfs->xOpen)(pVfs,pPVar9->zFilename,pPVar9->fd,uVar8 & 0x87f7f,(int *)&local_a4);
        if (iVar7 == 0) {
          uVar18 = local_a4 & 1;
          bVar31 = (byte)uVar18;
          uVar8 = (*pPVar9->fd->pMethods->xDeviceCharacteristics)(pPVar9->fd);
          if (uVar18 == 0) {
            setSectorSize(pPVar9);
            uVar18 = pPVar9->sectorSize;
            if (0x1000 < uVar18) {
              if (uVar18 < 0x2001) {
                local_98[0] = uVar18;
              }
              else {
                local_98[0] = 0x2000;
              }
            }
          }
          iVar7 = sqlite3_uri_boolean(local_d8,"nolock",0);
          pPVar9->noLock = (u8)iVar7;
          if (((uVar8 >> 0xd & 1) != 0) ||
             (iVar7 = sqlite3_uri_boolean(local_d8,"immutable",0), iVar7 != 0)) {
            uVar8 = 1;
            goto LAB_0013a148;
          }
          bVar32 = true;
          uVar25 = '\0';
          goto LAB_0013a165;
        }
LAB_0013a1f8:
        psVar5 = pPVar9->fd;
        if (psVar5->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar5->pMethods->xClose)(psVar5);
          psVar5->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar9->pTmpSpace);
        goto LAB_0013a22a;
      }
LAB_0013a148:
      pPVar9->eState = '\x01';
      pPVar9->eLock = '\x04';
      pPVar9->noLock = '\x01';
      bVar31 = (byte)uVar8 & 1;
      uVar25 = '\x01';
      bVar32 = false;
LAB_0013a165:
      iVar7 = sqlite3PagerSetPagesize(pPVar9,local_98,-1);
      if (iVar7 != 0) goto LAB_0013a1f8;
      pcVar20 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
      if (uVar17 == 0) {
        pcVar20 = pagerStress;
      }
      pPVar4 = pPVar9->pPCache;
      pPVar4->szSpill = 0;
      pPVar4->szPage = 0;
      pPVar4->szExtra = 0;
      pPVar4->bPurgeable = '\0';
      pPVar4->eCreate = '\0';
      *(undefined2 *)&pPVar4->field_0x2e = 0;
      pPVar4->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
      pPVar4->pStress = (void *)0x0;
      pPVar4->pSynced = (PgHdr *)0x0;
      pPVar4->nRefSum = 0;
      pPVar4->szCache = 0;
      pPVar4->pDirty = (PgHdr *)0x0;
      pPVar4->pDirtyTail = (PgHdr *)0x0;
      pPVar4->pCache = (sqlite3_pcache *)0x0;
      pPVar4->szExtra = 0x88;
      pPVar4->bPurgeable = (byte)(uVar17 >> 1) ^ 1;
      pPVar4->eCreate = '\x02';
      pPVar4->xStress = pcVar20;
      pPVar4->pStress = pPVar9;
      pPVar4->szCache = 100;
      pPVar4->szSpill = 1;
      pPVar4->szPage = 1;
      iVar7 = sqlite3PcacheSetPageSize(pPVar4,local_98[0]);
      if (iVar7 != 0) goto LAB_0013a1f8;
      pPVar9->useJournal = (byte)(local_ec & 1) ^ 1;
      pPVar9->mxPgno = 0x3fffffff;
      pPVar9->tempFile = uVar25;
      pPVar9->exclusiveMode = uVar25;
      pPVar9->changeCountDone = uVar25;
      pPVar9->memDb = local_c0;
      pPVar9->readOnly = bVar31;
      pPVar9->noSync = uVar25;
      if (bVar32) {
        pPVar9->fullSync = '\x01';
        pPVar9->extraSync = '\0';
        pPVar9->syncFlags = '\x02';
        pPVar9->walSyncFlags = '\n';
      }
      pPVar9->nExtra = 0x88;
      pPVar9->journalSizeLimit = -1;
      setSectorSize(pPVar9);
      if ((local_ec & 3) != 0) {
        pPVar9->journalMode = ((local_ec & 1) == 0) * '\x02' + '\x02';
      }
      pPVar9->xReiniter = pageReinit;
      if (pPVar9->errCode == 0) {
        if (pPVar9->bUseFetch == '\0') {
          pcVar20 = getPageNormal;
        }
        else {
          pcVar20 = getPageMMap;
        }
        pPVar9->xGet = pcVar20;
      }
      else {
        pPVar9->xGet = getPageError;
      }
      __s->pPager = pPVar9;
      pPVar9->szMmap = db->szMmap;
      pagerFixMaplimit(pPVar9);
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_38 = 0;
      psVar5 = __s->pPager->fd;
      psVar6 = psVar5->pMethods;
      if (((psVar6 == (sqlite3_io_methods *)0x0) ||
          (iVar7 = (*psVar6->xRead)(psVar5,local_98,100,0), iVar7 == 0x20a)) || (iVar7 == 0)) {
        __s->openFlags = (u8)local_ec;
        __s->db = db;
        pPVar9 = __s->pPager;
        pPVar9->xBusyHandler = btreeInvokeBusyHandler;
        pPVar9->pBusyHandlerArg = __s;
        psVar6 = pPVar9->fd->pMethods;
        if (psVar6 != (sqlite3_io_methods *)0x0) {
          (*psVar6->xFileControl)(pPVar9->fd,0xf,&pPVar9->xBusyHandler);
          pPVar9 = __s->pPager;
        }
        p->pBt = __s;
        __s->pCursor = (BtCursor *)0x0;
        __s->pPage1 = (MemPage *)0x0;
        if (pPVar9->readOnly != '\0') {
          *(byte *)&__s->btsFlags = (byte)__s->btsFlags | 1;
        }
        iVar7 = (int)((local_88 & 0xff) << 8);
        uVar17 = (uint)local_88._1_1_ * 0x10000 + iVar7;
        __s->pageSize = uVar17;
        if (((iVar7 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
           ((uVar17 + 0x1ffff & uVar17) != 0)) {
          __s->pageSize = 0;
          uVar17 = 0;
          if (zFilename != (char *)0x0 && local_c4 == 0) {
            __s->autoVacuum = '\0';
            __s->incrVacuum = '\0';
            uVar17 = 0;
          }
        }
        else {
          uVar17 = (uint)local_88._4_1_;
          __s->btsFlags = __s->btsFlags | 2;
          __s->autoVacuum =
               ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
               (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
          __s->incrVacuum =
               (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) ||
               (local_58 & 0xff00) != 0) || (local_58 & 0xff) != 0;
        }
        iVar7 = sqlite3PagerSetPagesize(pPVar9,&__s->pageSize,uVar17);
        if (iVar7 == 0) {
          __s->usableSize = __s->pageSize - uVar17;
          __s->nRef = 1;
          if (p->sharable != '\0') {
            if (sqlite3Config.bCoreMutex != 0) {
              psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2);
              if (sqlite3Config.bCoreMutex != 0) {
                psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                __s->mutex = psVar15;
                if (psVar15 == (sqlite3_mutex *)0x0) goto LAB_00139bec;
              }
              if (psVar14 != (sqlite3_mutex *)0x0) {
                (*sqlite3Config.mutex.xMutexEnter)(psVar14);
                __s->pNext = sqlite3SharedCacheList;
                sqlite3SharedCacheList = __s;
                (*sqlite3Config.mutex.xMutexLeave)(psVar14);
                goto LAB_00139fe8;
              }
            }
            __s->pNext = sqlite3SharedCacheList;
            sqlite3SharedCacheList = __s;
          }
LAB_00139fe8:
          if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
            lVar23 = 0;
            do {
              pBVar28 = *(Btree **)((long)&db->aDb->pBt + lVar23);
              if ((pBVar28 != (Btree *)0x0) && (pBVar28->sharable != '\0')) goto LAB_0013a03c;
              lVar23 = lVar23 + 0x20;
            } while ((long)db->nDb * 0x20 != lVar23);
          }
          goto LAB_0013a5a1;
        }
      }
    }
LAB_0013a234:
    if (__s->pPager != (Pager *)0x0) {
      sqlite3PagerClose(__s->pPager,(sqlite3 *)0x0);
    }
  }
  sqlite3_free(__s);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
LAB_0013a25c:
  if (local_110 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_110);
  }
  return iVar7;
LAB_00139edc:
  ppBVar1 = &__s->pNext;
  __s = *ppBVar1;
  if (*ppBVar1 == (BtShared *)0x0) goto code_r0x00139ee5;
  goto LAB_00139eb7;
code_r0x00139ee5:
  __s = (BtShared *)0x0;
LAB_00139fbb:
  if (!bVar32) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar14);
  }
  sqlite3_free(pcVar12);
  if (__s == (BtShared *)0x0) goto LAB_001398e7;
  goto LAB_00139fe8;
LAB_0013a03c:
  do {
    pBVar24 = pBVar28;
    pBVar28 = pBVar24->pPrev;
  } while (pBVar24->pPrev != (Btree *)0x0);
  lVar23 = 0x20;
  if (p->pBt < pBVar24->pBt) {
    ppBVar19 = &pBVar24->pPrev;
    pBVar21 = (Btree *)0x0;
    pBVar28 = p;
  }
  else {
    do {
      pBVar27 = pBVar24;
      pBVar28 = pBVar27->pNext;
      if (pBVar28 == (Btree *)0x0) {
        ppBVar19 = &pBVar27->pNext;
        pBVar24 = (Btree *)0x0;
        pBVar21 = pBVar27;
        pBVar28 = p;
        goto LAB_0013a596;
      }
      pBVar24 = pBVar28;
    } while (pBVar28->pBt < p->pBt);
    ppBVar19 = &pBVar27->pNext;
    p->pNext = pBVar28;
    lVar23 = 0x28;
    pBVar21 = p;
    pBVar24 = pBVar27;
  }
LAB_0013a596:
  *(Btree **)((long)&p->db + lVar23) = pBVar24;
  pBVar28->pPrev = pBVar21;
  *ppBVar19 = p;
LAB_0013a5a1:
  *ppBtree = p;
  iVar7 = 0;
  pvVar16 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar16 == (void *)0x0) {
    pPVar4 = p->pBt->pPager->pPCache;
    pPVar4->szCache = -2000;
    (*sqlite3Config.pcache2.xCachesize)
              (pPVar4->pCache,(int)(0x1f4000 / (long)(pPVar4->szExtra + pPVar4->szPage)));
  }
  psVar5 = __s->pPager->fd;
  psVar6 = psVar5->pMethods;
  if (psVar6 != (sqlite3_io_methods *)0x0) {
    (*psVar6->xFileControl)(psVar5,0x1e,&__s->db);
  }
  goto LAB_0013a25c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyHandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}